

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool (anonymous_namespace)::InfoWriter::
     MakeArray<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
               (Value *jval,
               vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
               *container)

{
  size_type sVar1;
  size_t listSize;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  *local_20;
  vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
  *container_local;
  Value *jval_local;
  
  local_20 = container;
  container_local =
       (vector<const_cmQtAutoGenInitializer::MUFile_*,_std::allocator<const_cmQtAutoGenInitializer::MUFile_*>_>
        *)jval;
  Json::Value::Value((Value *)&listSize,arrayValue);
  Json::Value::operator=((Value *)container_local,(Value *)&listSize);
  Json::Value::~Value((Value *)&listSize);
  sVar1 = std::
          size<std::vector<cmQtAutoGenInitializer::MUFile_const*,std::allocator<cmQtAutoGenInitializer::MUFile_const*>>>
                    (local_20);
  if (sVar1 != 0) {
    Json::Value::resize((Value *)container_local,(ArrayIndex)sVar1);
  }
  return sVar1 != 0;
}

Assistant:

bool InfoWriter::MakeArray(Json::Value& jval, CONT const& container)
{
  jval = Json::arrayValue;
  std::size_t const listSize = cm::size(container);
  if (listSize == 0) {
    return false;
  }
  jval.resize(static_cast<unsigned int>(listSize));
  return true;
}